

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void websocket_store_set(ws_session_t *session,uint16_t index,void *value)

{
  void **ppvVar1;
  
  if ((session->store).items == (void **)0x0) {
    ppvVar1 = (void **)calloc(1,0x40);
    (session->store).items = ppvVar1;
    (session->store).capacity = 2;
  }
  if ((session->store).capacity <= (uint)index) {
    (session->store).capacity = index + 1;
    ppvVar1 = (void **)realloc((session->store).items,(ulong)((uint)index * 8 + 8));
    (session->store).items = ppvVar1;
    if (ppvVar1 == (void **)0x0) {
      __assert_fail("session->store.items != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                    ,0x599,"void websocket_store_set(ws_session_t *, uint16_t, void *)");
    }
  }
  (session->store).items[index] = value;
  return;
}

Assistant:

void websocket_store_set(ws_session_t *session, uint16_t index, void *value) {
    if (session->store.items == NULL) {
        session->store.items = (void **) calloc(1, sizeof(void *) * REQUEST_HEADER_INIT_SIZE);
        session->store.capacity = WEBSOCKET_CONTEXT_STORE_INIT;
    }

    if (session->store.capacity <= index) {
        session->store.capacity = index + 1;
        session->store.items = (void **) realloc(session->store.items, sizeof(void *) * session->store.capacity);
        assert(session->store.items != NULL);
    }

    session->store.items[index] = value;
}